

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_str.c
# Opt level: O0

int32_t lj_str_cmp(GCstr *a,GCstr *b)

{
  uint uVar1;
  uint uVar2;
  char cVar3;
  uint local_3c;
  uint32_t vb;
  uint32_t va;
  MSize n;
  MSize i;
  GCstr *b_local;
  GCstr *a_local;
  uint32_t r_1;
  uint32_t r;
  
  if (b->len < a->len) {
    local_3c = b->len;
  }
  else {
    local_3c = a->len;
  }
  i = 0;
  do {
    if (local_3c <= i) {
LAB_00110b92:
      return a->len - b->len;
    }
    uVar1 = *(uint *)((long)&a[1].nextgc.gcptr32 + (ulong)i);
    uVar2 = *(uint *)((long)&b[1].nextgc.gcptr32 + (ulong)i);
    if (uVar1 != uVar2) {
      va = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      vb = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      if (-4 < (int)(i - local_3c)) {
        cVar3 = (char)(i - local_3c);
        va = va >> (cVar3 * '\b' + 0x20U & 0x1f);
        vb = vb >> (cVar3 * '\b' + 0x20U & 0x1f);
        if (va == vb) goto LAB_00110b92;
      }
      if (vb <= va) {
        return 1;
      }
      return -1;
    }
    i = i + 4;
  } while( true );
}

Assistant:

int32_t LJ_FASTCALL lj_str_cmp(GCstr *a, GCstr *b)
{
  MSize i, n = a->len > b->len ? b->len : a->len;
  for (i = 0; i < n; i += 4) {
    /* Note: innocuous access up to end of string + 3. */
    uint32_t va = *(const uint32_t *)(strdata(a)+i);
    uint32_t vb = *(const uint32_t *)(strdata(b)+i);
    if (va != vb) {
#if LJ_LE
      va = lj_bswap(va); vb = lj_bswap(vb);
#endif
      i -= n;
      if ((int32_t)i >= -3) {
	va >>= 32+(i<<3); vb >>= 32+(i<<3);
	if (va == vb) break;
      }
      return va < vb ? -1 : 1;
    }
  }
  return (int32_t)(a->len - b->len);
}